

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

CPAccessResult access_ttlb(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  uint uVar1;
  uint64_t uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = (uint)env->features;
  if ((uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar1 = 0;
      }
      else if (uVar3 == 0x16) {
        uVar1 = 3;
      }
      else if (uVar3 == 0x1a) {
        uVar1 = 2;
      }
      else {
        if ((env->features >> 0x21 & 1) != 0) {
          bVar4 = uVar3 == 0x16;
          if (!bVar4) {
            bVar4 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar1 >> 0x1c & 1) == 0) && (uVar1 = 3, bVar4)) goto LAB_0061eb3e;
        }
        uVar1 = 1;
      }
    }
    else {
      uVar1 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar1 = 1;
    if ((env->v7m).exception == 0) {
      uVar1 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061eb3e:
  if ((uVar1 == 1) && (uVar2 = arm_hcr_el2_eff_aarch64(env), ((uint)uVar2 >> 0x19 & 1) != 0)) {
    return CP_ACCESS_TRAP_EL2;
  }
  return CP_ACCESS_OK;
}

Assistant:

static inline int arm_feature(CPUARMState *env, int feature)
{
    return (env->features & (1ULL << feature)) != 0;
}